

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  uint num_syms;
  uint8 *pCodesizes;
  bool bVar1;
  uint table_bits;
  undefined8 in_RAX;
  void *pContext;
  decoder_tables *pTables;
  uint16 *in_RCX;
  uint in_EDX;
  uint in_R8D;
  uint max_code_size_00;
  uint max_code_size;
  uint total_freq;
  
  total_freq = (uint)((ulong)in_RAX >> 0x20);
  this->m_encoding = SUB81(ctx,0);
  this->m_total_syms = in_EDX;
  max_code_size_00 = 0x10;
  if (in_R8D < 0x10) {
    max_code_size_00 = in_R8D;
  }
  pTables = (decoder_tables *)0x0;
  vector<unsigned_char>::resize(&this->m_code_sizes,in_EDX,false);
  pContext = create_generate_huffman_codes_tables();
  _max_code_size = (ulong)total_freq << 0x20;
  bVar1 = generate_huffman_codes
                    (pContext,this->m_total_syms,in_RCX,(this->m_code_sizes).m_p,&max_code_size,
                     &total_freq);
  free_generate_huffman_codes_tables(pContext);
  if (!bVar1) {
    return 0;
  }
  if ((max_code_size <= max_code_size_00) ||
     (bVar1 = prefix_coding::limit_max_code_size
                        (this->m_total_syms,(this->m_code_sizes).m_p,max_code_size_00), bVar1)) {
    if (this->m_encoding == true) {
      vector<unsigned_short>::resize(&this->m_codes,in_EDX,false);
      if (this->m_pDecode_tables != (decoder_tables *)0x0) {
        crnlib_delete<crnlib::prefix_coding::decoder_tables>(this->m_pDecode_tables);
        this->m_pDecode_tables = (decoder_tables *)0x0;
      }
      bVar1 = prefix_coding::generate_codes
                        (this->m_total_syms,(this->m_code_sizes).m_p,(this->m_codes).m_p);
    }
    else {
      vector<unsigned_short>::clear(&this->m_codes);
      pTables = this->m_pDecode_tables;
      if (pTables == (decoder_tables *)0x0) {
        pTables = crnlib_new<crnlib::prefix_coding::decoder_tables>();
        this->m_pDecode_tables = pTables;
      }
      num_syms = this->m_total_syms;
      pCodesizes = (this->m_code_sizes).m_p;
      table_bits = compute_decoder_table_bits(this);
      bVar1 = prefix_coding::generate_decoder_tables(num_syms,pCodesizes,pTables,table_bits);
    }
    if (bVar1 != false) {
      return (int)CONCAT71((int7)((ulong)pTables >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint16* pSym_freq, uint code_size_limit)
    {
        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

        m_encoding = encoding;

        m_total_syms = total_syms;

        code_size_limit = math::minimum(code_size_limit, prefix_coding::cMaxExpectedCodeSize);

        m_code_sizes.resize(total_syms);

        void* pTables = create_generate_huffman_codes_tables();

        uint max_code_size = 0, total_freq;
        bool status = generate_huffman_codes(pTables, m_total_syms, pSym_freq, &m_code_sizes[0], max_code_size, total_freq);

        free_generate_huffman_codes_tables(pTables);

        if (!status)
        {
            return false;
        }

        if (max_code_size > code_size_limit)
        {
            if (!prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], code_size_limit))
            {
                return false;
            }
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);

            if (m_pDecode_tables)
            {
                crnlib_delete(m_pDecode_tables);
                m_pDecode_tables = nullptr;
            }

            if (!prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]))
            {
                return false;
            }
        }
        else
        {
            m_codes.clear();

            if (!m_pDecode_tables)
            {
                m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
            }

            if (!prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits()))
            {
                return false;
            }
        }

        return true;
    }